

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O2

iterator __thiscall
Type1ToType2Converter::MergeAltenratingOperators
          (Type1ToType2Converter *this,iterator inStartingNode,unsigned_short inAlternatingOpcode)

{
  iterator __position;
  uint uVar1;
  short sVar2;
  
  uVar1 = (uint)inAlternatingOpcode;
  __position._M_node = (inStartingNode._M_node)->_M_next;
  while ((sVar2 = (short)uVar1, sVar2 == *(short *)&__position._M_node[1]._M_next &&
         ((ulong)((long)&(inStartingNode._M_node[2]._M_prev)->_M_next +
                 (long)&(__position._M_node[2]._M_prev)->_M_next) < 0x28))) {
    std::__cxx11::list<long,std::allocator<long>>::insert<std::_List_iterator<long>,void>
              ((list<long,std::allocator<long>> *)&inStartingNode._M_node[1]._M_prev,
               (const_iterator)&inStartingNode._M_node[1]._M_prev,__position._M_node[1]._M_prev,
               (_List_iterator<long>)&__position._M_node[1]._M_prev);
    __position = std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::erase
                           (&this->mConversionProgram,__position._M_node);
    uVar1 = *(uint *)&inStartingNode._M_node[1]._M_next;
    if ((short)uVar1 == sVar2) {
      uVar1 = (uint)inAlternatingOpcode;
    }
  }
  return (iterator)__position._M_node;
}

Assistant:

ConversionNodeList::iterator Type1ToType2Converter::MergeAltenratingOperators(ConversionNodeList::iterator inStartingNode,
																			  unsigned short inAlternatingOpcode)
{
	ConversionNodeList::iterator itNext = inStartingNode;
	++itNext;
	unsigned short currentMarker = inAlternatingOpcode;

	while(currentMarker == itNext->mMarkerType && (inStartingNode->mOperands.size()  + itNext->mOperands.size() < scMergeLimit))
	{
		inStartingNode->mOperands.insert(inStartingNode->mOperands.end(),itNext->mOperands.begin(),itNext->mOperands.end());
		itNext = mConversionProgram.erase(itNext);
		currentMarker = inStartingNode->mMarkerType == currentMarker ? inAlternatingOpcode:inStartingNode->mMarkerType;
	}
	return itNext;
}